

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

string * __thiscall
tinyformat::format<unsigned_long,std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,unsigned_long *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream aoStack_1e8 [112];
  ios_base local_178 [264];
  FormatArg *local_70;
  undefined4 local_68;
  FormatArg local_60;
  unsigned_long *local_48;
  code *local_40;
  code *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(aoStack_1e8);
  local_70 = &local_60;
  local_68 = 2;
  local_60.m_formatImpl = detail::FormatArg::formatImpl<unsigned_long>;
  local_60.m_toIntImpl = detail::FormatArg::toIntImpl<unsigned_long>;
  local_40 = detail::FormatArg::formatImpl<std::basic_string_view<char,std::char_traits<char>>>;
  local_38 = detail::FormatArg::toIntImpl<std::basic_string_view<char,std::char_traits<char>>>;
  local_60.m_value = fmt;
  local_48 = args;
  detail::formatImpl((ostream *)aoStack_1e8,(char *)this,local_70,2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1e8);
  std::ios_base::~ios_base(local_178);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}